

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::writeAssertion
          (SonarQubeReporter *this,AssertionStats *stats,bool okToFail)

{
  uint uVar1;
  OfType OVar2;
  size_type sVar3;
  pointer pMVar4;
  StringRef attribute;
  StringRef text;
  ostream *poVar5;
  bool bVar6;
  ReusableStringStream *pRVar7;
  XmlWriter *this_00;
  MessageInfo *msg;
  pointer pMVar8;
  StringRef name;
  char local_9a [2];
  string local_98;
  ReusableStringStream textRss;
  ReusableStringStream messageRss;
  ScopedElement e;
  string elementName;
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar2 == ExplicitSkip) ||
     (((byte)OVar2 >> 4 & ((stats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)
      != 0)) {
    elementName._M_dataplus._M_p = (pointer)&elementName.field_2;
    elementName._M_string_length = 0;
    elementName.field_2._M_local_buf[0] = '\0';
    if (((okToFail) ||
        ((uVar1 = OVar2 + Info, uVar1 < 0x14 &&
         ((((0x2000fU >> (uVar1 & 0x1f) & 1) != 0 || ((0xc0000U >> (uVar1 & 0x1f) & 1) != 0)) ||
          (uVar1 == 5)))))) ||
       ((((OVar2 == Exception || (OVar2 == ThrewException)) || (OVar2 == FatalErrorCondition)) ||
        (OVar2 == DidntThrowException)))) {
      std::__cxx11::string::assign((char *)&elementName);
    }
    this_00 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&elementName);
    ReusableStringStream::ReusableStringStream(&messageRss);
    textRss.m_index = (size_t)(stats->assertionResult).m_info.macroName.m_start;
    textRss.m_oss = (ostream *)(stats->assertionResult).m_info.macroName.m_size;
    pRVar7 = ReusableStringStream::operator<<(&messageRss,(StringRef *)&textRss);
    local_9a[0] = '(';
    pRVar7 = ReusableStringStream::operator<<(pRVar7,local_9a);
    AssertionResult::getExpression_abi_cxx11_(&local_98,&stats->assertionResult);
    pRVar7 = ReusableStringStream::operator<<(pRVar7,&local_98);
    local_9a[1] = 0x29;
    ReusableStringStream::operator<<(pRVar7,local_9a + 1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::stringbuf::str();
    attribute.m_size = local_98._M_string_length;
    attribute.m_start = local_98._M_dataplus._M_p;
    name.m_size = 7;
    name.m_start = "message";
    XmlWriter::writeAttribute(this_00,name,attribute);
    std::__cxx11::string::~string((string *)&local_98);
    ReusableStringStream::ReusableStringStream(&textRss);
    poVar5 = textRss.m_oss;
    if ((stats->assertionResult).m_resultData.resultType == ExplicitSkip) {
      std::operator<<(textRss.m_oss,"SKIPPED\n");
    }
    else {
      std::operator<<(textRss.m_oss,"FAILED:\n");
      if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
        std::operator<<(poVar5,'\t');
        AssertionResult::getExpressionInMacro_abi_cxx11_(&local_98,&stats->assertionResult);
        std::operator<<(poVar5,(string *)&local_98);
        std::operator<<(poVar5,'\n');
        std::__cxx11::string::~string((string *)&local_98);
      }
      bVar6 = AssertionResult::hasExpandedExpression(&stats->assertionResult);
      if (bVar6) {
        std::operator<<(poVar5,"with expansion:\n\t");
        AssertionResult::getExpandedExpression_abi_cxx11_(&local_98,&stats->assertionResult);
        std::operator<<(poVar5,(string *)&local_98);
        std::operator<<(poVar5,'\n');
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    sVar3 = (stats->assertionResult).m_resultData.message._M_string_length;
    if (sVar3 != 0) {
      local_98._M_dataplus._M_p = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_98._M_string_length = sVar3;
      pRVar7 = ReusableStringStream::operator<<(&textRss,(StringRef *)&local_98);
      local_9a[0] = '\n';
      ReusableStringStream::operator<<(pRVar7,local_9a);
    }
    pMVar4 = (stats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar8 = (stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar8 != pMVar4; pMVar8 = pMVar8 + 1) {
      if (pMVar8->type == Info) {
        std::operator<<(textRss.m_oss,(string *)&pMVar8->message);
        std::operator<<(textRss.m_oss,'\n');
      }
    }
    std::operator<<(textRss.m_oss,"at ");
    local_98._M_dataplus._M_p = (stats->assertionResult).m_info.lineInfo.file;
    local_98._M_string_length = (stats->assertionResult).m_info.lineInfo.line;
    Catch::operator<<(textRss.m_oss,(SourceLineInfo *)&local_98);
    std::__cxx11::stringbuf::str();
    text.m_size = local_98._M_string_length;
    text.m_start = local_98._M_dataplus._M_p;
    XmlWriter::writeText(this_00,text,Newline);
    std::__cxx11::string::~string((string *)&local_98);
    ReusableStringStream::~ReusableStringStream(&textRss);
    ReusableStringStream::~ReusableStringStream(&messageRss);
    XmlWriter::ScopedElement::~ScopedElement(&e);
    std::__cxx11::string::~string((string *)&elementName);
  }
  return;
}

Assistant:

void SonarQubeReporter::writeAssertion(AssertionStats const& stats, bool okToFail) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            if (okToFail) {
                elementName = "skipped";
            } else {
                switch (result.getResultType()) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                    // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
                }
            }

            XmlWriter::ScopedElement e = xml.scopedElement(elementName);

            ReusableStringStream messageRss;
            messageRss << result.getTestMacroName() << '(' << result.getExpression() << ')';
            xml.writeAttribute("message"_sr, messageRss.str());

            ReusableStringStream textRss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                textRss << "SKIPPED\n";
            } else {
                textRss << "FAILED:\n";
                if (result.hasExpression()) {
                    textRss << '\t' << result.getExpressionInMacro() << '\n';
                }
                if (result.hasExpandedExpression()) {
                    textRss << "with expansion:\n\t" << result.getExpandedExpression() << '\n';
                }
            }

            if (result.hasMessage())
                textRss << result.getMessage() << '\n';

            for (auto const& msg : stats.infoMessages)
                if (msg.type == ResultWas::Info)
                    textRss << msg.message << '\n';

            textRss << "at " << result.getSourceInfo();
            xml.writeText(textRss.str(), XmlFormatting::Newline);
        }
    }